

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndBufferAgeTest::checkExtension
          (SwapBuffersWithDamageAndBufferAgeTest *this,Library *egl,EGLDisplay eglDisplay)

{
  EGLDisplay display;
  EGLDisplay egl_00;
  bool bVar1;
  NotSupportedError *pNVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  EGLDisplay local_20;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  SwapBuffersWithDamageAndBufferAgeTest *this_local;
  
  local_20 = eglDisplay;
  eglDisplay_local = egl;
  egl_local = (Library *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EGL_KHR_swap_buffers_with_damage",&local_41);
  bVar1 = eglu::hasExtension(egl,eglDisplay,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  egl_00 = eglDisplay_local;
  display = local_20;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"EGL_KHR_swap_buffers_with_damage is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
               ,0x22e);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"EGL_EXT_buffer_age",&local_79);
  bVar1 = eglu::hasExtension((Library *)egl_00,display,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar2,"EGL_EXT_buffer_age not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
             ,0x231);
  __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SwapBuffersWithDamageAndBufferAgeTest::checkExtension (const Library& egl, EGLDisplay eglDisplay)
{
	if (!eglu::hasExtension(egl, eglDisplay, "EGL_KHR_swap_buffers_with_damage"))
		TCU_THROW(NotSupportedError, "EGL_KHR_swap_buffers_with_damage is not supported");

	if (!eglu::hasExtension(egl, eglDisplay, "EGL_EXT_buffer_age"))
		TCU_THROW(NotSupportedError, "EGL_EXT_buffer_age not supported");
}